

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalBGValueFunctionVector.h
# Opt level: O2

double __thiscall
LocalBGValueFunctionVector::GetValue
          (LocalBGValueFunctionVector *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indPols)

{
  Index IVar1;
  const_reference pvVar2;
  
  IVar1 = IndexTools::IndividualToJointIndices(indPols,&this->_m_nrIndivPols);
  pvVar2 = std::vector<double,_std::allocator<double>_>::at(&this->_m_values,(ulong)IVar1);
  return *pvVar2;
}

Assistant:

double GetValue(std::vector<Index> indPols) const
        { return _m_values.at(
            IndexTools::IndividualToJointIndices(indPols, _m_nrIndivPols)
                ) ;}